

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testInit
          (VaryingExceedingComponentsTest *this)

{
  vector<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase>_>
  *this_00;
  GLuint index;
  GLuint stage;
  STAGES SVar1;
  GLuint GVar2;
  Type TVar3;
  value_type local_90;
  value_type local_78;
  value_type local_60;
  value_type local_48;
  
  this_00 = &this->m_test_cases;
  for (index = 0; index != 0x22; index = index + 1) {
    TVar3 = TestBase::getType((TestBase *)this,index);
    GVar2 = 5 - TVar3.m_n_rows;
    for (SVar1 = COMPUTE; SVar1 != STAGE_MAX; SVar1 = SVar1 + VERTEX) {
      if ((SVar1 != COMPUTE) && ((TVar3._0_8_ & 0xffffffff00000000) == 0x100000000)) {
        local_48.m_is_input = true;
        local_48.m_is_array = true;
        local_60.m_is_input = true;
        local_60.m_is_array = false;
        local_78.m_is_input = false;
        local_78.m_is_array = true;
        local_90.m_is_input = false;
        local_90.m_is_array = false;
        local_90.m_component = GVar2;
        local_90.m_stage = SVar1;
        local_90.m_type = TVar3;
        local_78.m_component = GVar2;
        local_78.m_stage = SVar1;
        local_60.m_component = GVar2;
        local_60.m_stage = SVar1;
        local_60.m_type = TVar3;
        local_48.m_component = GVar2;
        local_48.m_stage = SVar1;
        local_48.m_type = TVar3;
        local_78.m_type = TVar3;
        std::
        vector<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase>_>
        ::push_back(this_00,&local_48);
        this = (VaryingExceedingComponentsTest *)this_00;
        std::
        vector<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase>_>
        ::push_back(this_00,&local_60);
        if (SVar1 != FRAGMENT) {
          std::
          vector<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase>_>
          ::push_back(this_00,&local_78);
          this = (VaryingExceedingComponentsTest *)this_00;
          std::
          vector<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingExceedingComponentsTest::testCase>_>
          ::push_back(this_00,&local_90);
        }
      }
    }
  }
  return;
}

Assistant:

void VaryingExceedingComponentsTest::testInit()
{
	static const GLuint n_components_per_location = 4;
	const GLuint		n_types					  = getTypesNumber();

	for (GLuint i = 0; i < n_types; ++i)
	{
		const Utils::Type& type				 = getType(i);
		const GLuint	   n_req_components  = type.m_n_rows;
		const GLuint	   valid_component   = n_components_per_location - n_req_components;
		const GLuint	   invalid_component = valid_component + 1;

		for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
		{
			if (Utils::Shader::COMPUTE == stage)
			{
				continue;
			}

			/* Component cannot be used for matrices */
			if (1 != type.m_n_columns)
			{
				continue;
			}

			testCase test_case_in_arr  = { invalid_component, true, true, (Utils::Shader::STAGES)stage, type };
			testCase test_case_in_one  = { invalid_component, true, false, (Utils::Shader::STAGES)stage, type };
			testCase test_case_out_arr = { invalid_component, false, true, (Utils::Shader::STAGES)stage, type };
			testCase test_case_out_one = { invalid_component, false, false, (Utils::Shader::STAGES)stage, type };

			m_test_cases.push_back(test_case_in_arr);
			m_test_cases.push_back(test_case_in_one);

			if (Utils::Shader::FRAGMENT != stage)
			{
				m_test_cases.push_back(test_case_out_arr);
				m_test_cases.push_back(test_case_out_one);
			}
		}
	}
}